

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O3

uint dos_time(time_t unix_time)

{
  uint uVar1;
  tm *ptVar2;
  uint uVar3;
  tm_conflict1 tmbuf;
  time_t local_40;
  tm local_38;
  
  ptVar2 = localtime_r(&local_40,&local_38);
  uVar1 = ptVar2->tm_year;
  uVar3 = 0x210000;
  if ((0x4f < (int)uVar1) && (uVar3 = 0xff9fbf7d, uVar1 < 0xd0)) {
    uVar3 = ((uint)ptVar2->tm_sec >> 1 & 0x1f) +
            ((ptVar2->tm_min & 0x3fU) << 5 |
            (ptVar2->tm_hour & 0x1fU) << 0xb |
            (ptVar2->tm_mday & 0x1fU | ptVar2->tm_mon * 0x20 + 0x20U & 0x1e0 | uVar1 << 9) << 0x10)
            + 0x60000000;
  }
  return uVar3;
}

Assistant:

static unsigned int
dos_time(const time_t unix_time)
{
	struct tm *t;
	unsigned int dt;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE__LOCALTIME64_S)
	struct tm tmbuf;
#endif
#if defined(HAVE__LOCALTIME64_S)
	errno_t terr;
	__time64_t tmptime;
#endif

	/* This will not preserve time when creating/extracting the archive
	 * on two systems with different time zones. */
#if defined(HAVE_LOCALTIME_R)
	t = localtime_r(&unix_time, &tmbuf);
#elif defined(HAVE__LOCALTIME64_S)
	tmptime = unix_time;
	terr = _localtime64_s(&tmbuf, &tmptime);
	if (terr)
		t = NULL;
	else
		t = &tmbuf;
#else
	t = localtime(&unix_time);
#endif

	/* MSDOS-style date/time is only between 1980-01-01 and 2107-12-31 */
	if (t->tm_year < 1980 - 1900)
		/* Set minimum date/time '1980-01-01 00:00:00'. */
		dt = 0x00210000U;
	else if (t->tm_year > 2107 - 1900)
		/* Set maximum date/time '2107-12-31 23:59:58'. */
		dt = 0xff9fbf7dU;
	else {
		dt = 0;
		dt += ((t->tm_year - 80) & 0x7f) << 9;
		dt += ((t->tm_mon + 1) & 0x0f) << 5;
		dt += (t->tm_mday & 0x1f);
		dt <<= 16;
		dt += (t->tm_hour & 0x1f) << 11;
		dt += (t->tm_min & 0x3f) << 5;
		dt += (t->tm_sec & 0x3e) >> 1; /* Only counting every 2 seconds. */
	}
	return dt;
}